

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretWord.cpp
# Opt level: O0

bool userWon(string *verify,char (*guesses) [10])

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  int local_2c;
  int local_28;
  int j;
  int i;
  int correctGuesses;
  char (*guesses_local) [10];
  string *verify_local;
  
  j = 0;
  for (local_28 = 0; local_28 < 10; local_28 = local_28 + 1) {
    for (local_2c = 0; uVar1 = std::__cxx11::string::length(), (ulong)(long)local_2c < uVar1;
        local_2c = local_2c + 1) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)verify);
      if (*pcVar2 == (*guesses)[local_28]) {
        j = j + 1;
      }
    }
  }
  lVar3 = std::__cxx11::string::length();
  return j == lVar3;
}

Assistant:

bool userWon(string verify, char (&guesses)[GUESS_NUM])
{
    //function to see if our user has won the game yet
    //returns true or false
    //this checks the number of correct guessed characters verses the number of unique letters

    int correctGuesses = 0;

    for(int i = 0; i < GUESS_NUM; i++)
    {
        for(int j = 0; j < verify.length(); j++)
        {
            if(verify.at(j) == guesses[i])
            {
                correctGuesses++;
            }
        }
    }

    if(correctGuesses == verify.length())
    {
        return true;
    }
    else
    {
        return false;
    }
}